

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print<just::lines::iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,false>>
               (iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                *begin_,iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                        *end_)

{
  ostream *poVar1;
  iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  i;
  undefined1 local_60 [64];
  
  just::lines::
  iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ::iterator((iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              *)local_60,begin_);
  do {
    if (((local_60[0x10] | end_->_at_end) & 1U) == 0) {
      if ((char *)local_60._0_8_ == (end_->_at)._M_current) {
LAB_001035cd:
        std::__cxx11::string::~string((string *)(local_60 + 0x18));
        return;
      }
    }
    else if ((local_60[0x10] & end_->_at_end) == 1) goto LAB_001035cd;
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)(local_60 + 0x18));
    std::endl<char,std::char_traits<char>>(poVar1);
    just::lines::
    iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ::operator++((iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                  *)local_60);
  } while( true );
}

Assistant:

void print(InputIt begin_, InputIt end_)
{
  for (InputIt i = begin_; i != end_; ++i)
  {
    std::cout << *i << std::endl;
  }
}